

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O1

void blend_color_generic(int count,QT_FT_Span *spans,void *userData)

{
  BPP BVar1;
  char cVar2;
  QRgb QVar3;
  int iVar4;
  QThreadPool *pQVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long in_FS_OFFSET;
  QSemaphore semaphore;
  Operator op;
  anon_class_208_6_629cd7f6 function;
  undefined1 *local_1c0;
  Operator local_1b8;
  anon_class_208_6_629cd7f6 local_108;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(&local_1b8,&DAT_006dea50,0xb0);
  getOperator(&local_1b8,(QSpanData *)userData,(QT_FT_Span *)0x0,0);
  QVar3 = QColor::rgba((QColor *)((long)userData + 0x98));
  BVar1 = qPixelLayouts[*(uint *)(*userData + 0x10)].bpp;
  memcpy(&local_108,&DAT_006de980,0xd0);
  local_108.solidFill = local_1b8.mode == CompositionMode_Source;
  local_108.spans = spans;
  local_108.bpp = BVar1;
  memcpy(&local_108.op,&local_1b8,0xb0);
  iVar10 = count + 0x5f;
  if (-1 < count + 0x20) {
    iVar10 = count + 0x20;
  }
  local_108.data = (QSpanData *)userData;
  local_108.color = QVar3;
  pQVar5 = QGuiApplicationPrivate::qtGuiThreadPool();
  if (((0x5f < count) && (pQVar5 != (QThreadPool *)0x0)) &&
     (2 < (int)qPixelLayouts[*(uint *)(*userData + 0x10)].bpp)) {
    QThread::currentThread();
    cVar2 = QThreadPool::contains((QThread *)pQVar5);
    if (cVar2 == '\0') {
      iVar10 = iVar10 >> 6;
      local_1c0 = &DAT_aaaaaaaaaaaaaaaa;
      iVar11 = 0;
      QSemaphore::QSemaphore((QSemaphore *)&local_1c0,0);
      iVar4 = 1;
      if (1 < iVar10) {
        iVar4 = iVar10;
      }
      iVar8 = 0;
      do {
        iVar9 = (count - iVar8) / (iVar10 + iVar11);
        puVar6 = (undefined8 *)operator_new(0x18);
        *(undefined1 *)(puVar6 + 1) = 1;
        *puVar6 = QFactoryLoader::keyMap;
        puVar7 = (undefined8 *)operator_new(0x20);
        *puVar7 = QRunnable::QGenericRunnable::
                  Helper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/painting/qdrawhelper.cpp:4021:5)>
                  ::impl;
        *(int *)(puVar7 + 1) = iVar8;
        *(int *)((long)puVar7 + 0xc) = iVar9;
        puVar7[2] = &local_108;
        puVar7[3] = &local_1c0;
        puVar6[2] = puVar7;
        QThreadPool::start((QRunnable *)pQVar5,(int)puVar6);
        iVar8 = iVar8 + iVar9;
        iVar11 = iVar11 + -1;
      } while (-iVar4 != iVar11);
      QSemaphore::acquire((int)(QSemaphore *)&local_1c0);
      QSemaphore::~QSemaphore((QSemaphore *)&local_1c0);
      goto LAB_00662ee7;
    }
  }
  blend_color_generic::anon_class_208_6_629cd7f6::operator()(&local_108,0,count);
LAB_00662ee7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void blend_color_generic(int count, const QT_FT_Span *spans, void *userData)
{
    QSpanData *data = reinterpret_cast<QSpanData *>(userData);
    const Operator op = getOperator(data, nullptr, 0);
    const uint color = data->solidColor.rgba();
    const bool solidFill = op.mode == QPainter::CompositionMode_Source;
    const QPixelLayout::BPP bpp = qPixelLayouts[data->rasterBuffer->format].bpp;

    auto function = [=] (int cStart, int cEnd) {
        alignas(16) Q_DECL_UNINITIALIZED uint buffer[BufferSize];
        for (int c = cStart; c < cEnd; ++c) {
            int x = spans[c].x;
            int length = spans[c].len;
            if (solidFill && bpp >= QPixelLayout::BPP8 && spans[c].coverage == 255 && length && op.destStore) {
                // If dest doesn't matter we don't need to bother with blending or converting all the identical pixels
                op.destStore(data->rasterBuffer, x, spans[c].y, &color, 1);
                spanfill_from_first(data->rasterBuffer, bpp, x, spans[c].y, length);
                length = 0;
            }

            while (length) {
                int l = qMin(BufferSize, length);
                uint *dest = op.destFetch(buffer, data->rasterBuffer, x, spans[c].y, l);
                op.funcSolid(dest, l, color, spans[c].coverage);
                if (op.destStore)
                    op.destStore(data->rasterBuffer, x, spans[c].y, dest, l);
                length -= l;
                x += l;
            }
        }
    };
    QT_THREAD_PARALLEL_FILLS(function);
}